

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O1

void __thiscall
booster::intrusive_ptr<nonblocking_unit_test::binder>::~intrusive_ptr
          (intrusive_ptr<nonblocking_unit_test::binder> *this)

{
  binder *pbVar1;
  long lVar2;
  
  pbVar1 = this->p_;
  if (pbVar1 != (binder *)0x0) {
    lVar2 = booster::atomic_counter::dec();
    if (lVar2 == 0) {
      (*(pbVar1->super_callable<void_(cppcms::http::context::completion_type)>).super_refcounted.
        _vptr_refcounted[1])(pbVar1);
      return;
    }
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }